

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::TabBarProcessReorder(ImGuiTabBar *tab_bar)

{
  ImGuiID IVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ImGuiTabItem *pIVar5;
  float fVar6;
  float fVar7;
  ImGuiTabItemFlags IVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  ImGuiTabItem *in_RAX;
  ImGuiTabItem *pIVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  ImGuiTabItem *pIVar17;
  ulong uVar18;
  bool bVar19;
  ImGuiTabItem item_tmp;
  undefined3 uStack_1b;
  undefined5 uStack_18;
  
  IVar1 = tab_bar->ReorderRequestTabId;
  if (IVar1 != 0) {
    uVar15 = (ulong)(tab_bar->Tabs).Size;
    bVar19 = 0 < (long)uVar15;
    if (0 < (long)uVar15) {
      in_RAX = (tab_bar->Tabs).Data;
      bVar19 = true;
      if (in_RAX->ID != IVar1) {
        pIVar17 = in_RAX + (uVar15 - 1);
        pIVar13 = in_RAX;
        uVar11 = 1;
        do {
          uVar18 = uVar11;
          in_RAX = pIVar17;
          if (uVar15 == uVar18) break;
          in_RAX = pIVar13 + 1;
          pIVar5 = pIVar13 + 1;
          pIVar13 = in_RAX;
          uVar11 = uVar18 + 1;
        } while (pIVar5->ID != IVar1);
        bVar19 = uVar18 < uVar15;
      }
    }
    if (bVar19) goto LAB_0016d706;
  }
  in_RAX = (ImGuiTabItem *)0x0;
LAB_0016d706:
  if ((in_RAX != (ImGuiTabItem *)0x0) && ((in_RAX->Flags & 0x20U) == 0)) {
    pIVar13 = (tab_bar->Tabs).Data;
    iVar14 = (int)tab_bar->ReorderRequestOffset;
    uVar16 = (int)((ulong)((long)in_RAX - (long)pIVar13) >> 3) * -0x33333333 + iVar14;
    if ((-1 < (int)uVar16) && ((int)uVar16 < (tab_bar->Tabs).Size)) {
      if (((pIVar13[uVar16].Flags & 0x20U) == 0) &&
         (((pIVar13[uVar16].Flags ^ in_RAX->Flags) & 0xc0U) == 0)) {
        pIVar13 = pIVar13 + uVar16;
        uVar2._0_2_ = in_RAX->BeginOrder;
        uVar2._2_2_ = in_RAX->IndexDuringLayout;
        uVar2._4_1_ = in_RAX->WantClose;
        uVar2._5_3_ = *(undefined3 *)&in_RAX->field_0x25;
        uStack_18 = (undefined5)uVar2;
        IVar1 = in_RAX->ID;
        IVar8 = in_RAX->Flags;
        iVar9 = in_RAX->LastFrameVisible;
        iVar10 = in_RAX->LastFrameSelected;
        fVar6 = in_RAX->Offset;
        fVar7 = in_RAX->Width;
        uVar3 = in_RAX->ContentWidth;
        uVar4 = in_RAX->NameOffset;
        uStack_1b = (undefined3)((uint)uVar4 >> 8);
        pIVar17 = pIVar13 + 1;
        pIVar5 = pIVar13;
        if (0 < tab_bar->ReorderRequestOffset) {
          pIVar17 = in_RAX;
          pIVar5 = in_RAX + 1;
        }
        iVar12 = -iVar14;
        if (0 < iVar14) {
          iVar12 = iVar14;
        }
        memmove(pIVar17,pIVar5,(ulong)(uint)(iVar12 << 3) * 5);
        *(ulong *)((long)&pIVar13->NameOffset + 1) = CONCAT53(uStack_18,uStack_1b);
        pIVar13->Offset = fVar6;
        pIVar13->Width = fVar7;
        pIVar13->ContentWidth = (float)uVar3;
        pIVar13->NameOffset = uVar4;
        pIVar13->ID = IVar1;
        pIVar13->Flags = IVar8;
        pIVar13->LastFrameVisible = iVar9;
        pIVar13->LastFrameSelected = iVar10;
        if ((tab_bar->Flags & 0x400000) != 0) {
          MarkIniSettingsDirty();
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ImGui::TabBarProcessReorder(ImGuiTabBar* tab_bar)
{
    ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId);
    if (tab1 == NULL || (tab1->Flags & ImGuiTabItemFlags_NoReorder))
        return false;

    //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
    int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestOffset;
    if (tab2_order < 0 || tab2_order >= tab_bar->Tabs.Size)
        return false;

    // Reordered tabs must share the same section
    // (Note: TabBarQueueReorderFromMousePos() also has a similar test but since we allow direct calls to TabBarQueueReorder() we do it here too)
    ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
    if (tab2->Flags & ImGuiTabItemFlags_NoReorder)
        return false;
    if ((tab1->Flags & ImGuiTabItemFlags_SectionMask_) != (tab2->Flags & ImGuiTabItemFlags_SectionMask_))
        return false;

    ImGuiTabItem item_tmp = *tab1;
    ImGuiTabItem* src_tab = (tab_bar->ReorderRequestOffset > 0) ? tab1 + 1 : tab2;
    ImGuiTabItem* dst_tab = (tab_bar->ReorderRequestOffset > 0) ? tab1 : tab2 + 1;
    const int move_count = (tab_bar->ReorderRequestOffset > 0) ? tab_bar->ReorderRequestOffset : -tab_bar->ReorderRequestOffset;
    memmove(dst_tab, src_tab, move_count * sizeof(ImGuiTabItem));
    *tab2 = item_tmp;

    if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
        MarkIniSettingsDirty();
    return true;
}